

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var1;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var2;
  Index IVar3;
  pointer *__ptr;
  TypeModuleField *local_38;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_30;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> local_28;
  
  if (decl->has_func_type == false) {
    IVar3 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar3 == 0xffffffff) {
      MakeUnique<wabt::TypeModuleField,wabt::Location_const&>((wabt *)&local_38,loc);
      MakeUnique<wabt::FuncType>();
      FuncSignature::operator=((FuncSignature *)(local_28._M_head_impl + 1),&decl->sig);
      _Var2._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (TypeEntry *)0x0;
      _Var1._M_head_impl =
           (local_38->type)._M_t.
           super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
           super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
           super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
      (local_38->type)._M_t.
      super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
      super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
      super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = _Var2._M_head_impl;
      local_30._M_head_impl = local_38;
      if (_Var1._M_head_impl != (TypeEntry *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
        local_30._M_head_impl = local_38;
      }
      local_38 = (TypeModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)&local_30);
      if (local_30._M_head_impl != (TypeModuleField *)0x0) {
        (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_30._M_head_impl = (TypeModuleField *)0x0;
      if (local_28._M_head_impl != (TypeEntry *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
      if (local_38 != (TypeModuleField *)0x0) {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<TypeModuleField>(loc);
      auto func_type = MakeUnique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}